

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int readbtable(fitsfile *fptr,int *status)

{
  int iVar1;
  long *in_RSI;
  int *in_RDI;
  int *unaff_retaddr;
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long lnull;
  long nrows;
  long firstelem;
  long firstrow;
  long ntodo;
  long nremain;
  int anynull;
  int hdutype;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  float *pfVar2;
  fitsfile *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  LONGLONG firstelem_00;
  float *in_stack_ffffffffffffffc0;
  float *firstrow_00;
  undefined8 uVar3;
  fitsfile *fptr_00;
  float *local_20;
  
  fptr_00 = (fitsfile *)0x1;
  uVar3 = 0;
  firstelem_00 = 0;
  iVar1 = ffmrhd(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    printerror((int)((ulong)in_RSI >> 0x20));
  }
  ffgrsz(in_stack_ffffffffffffff98,(long *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (19999 < (long)in_stack_ffffffffffffffc0) {
    in_stack_ffffffffffffffc0 = (float *)0x4e20;
  }
  local_20 = (float *)0x2625a0;
  firstrow_00 = in_stack_ffffffffffffffc0;
  printf("Read back BINTABLE                              ");
  marktime((int *)in_stack_ffffffffffffff90);
  for (; local_20 != (float *)0x0; local_20 = (float *)((long)local_20 - (long)pfVar2)) {
    pfVar2 = local_20;
    if ((long)firstrow_00 < (long)local_20) {
      pfVar2 = firstrow_00;
    }
    in_stack_ffffffffffffff90 = pfVar2;
    ffgcvj(fptr_00,(int)((ulong)uVar3 >> 0x20),(LONGLONG)firstrow_00,firstelem_00,
           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RSI,in_RDI,unaff_retaddr
          );
    ffgcvj(fptr_00,(int)((ulong)uVar3 >> 0x20),(LONGLONG)firstrow_00,firstelem_00,
           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RSI,in_RDI,unaff_retaddr
          );
    fptr_00 = (fitsfile *)((long)pfVar2 + (long)fptr_00);
  }
  gettime(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffff90);
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,in_stack_ffffffffffffffa0,
         (double)(float)(((double)in_stack_ffffffffffffffac / (double)in_stack_ffffffffffffffa0) *
                        100.0),(double)(float)(20.0 / (double)in_stack_ffffffffffffffa0));
  return (int)*in_RSI;
}

Assistant:

int readbtable( fitsfile *fptr, int *status )

    /************************************************************/
    /* read and print data values from the binary table */
    /************************************************************/
{
    int hdutype, anynull;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    long lnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the table */
    if ( fits_movrel_hdu(fptr, 1, &hdutype, status) ) 
           printerror( *status );

    /* get table row size and optimum number of rows to read per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    
    /*  read the columns */  
    nremain = BROWS;

    printf("Read back BINTABLE                              ");
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffgcvj(fptr, 1, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      ffgcvj(fptr, 2, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      firstrow += ntodo; 
      nremain  -= ntodo;
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}